

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# molecule.cpp
# Opt level: O1

Uint __thiscall indigox::Molecule::AssignElectrons(Molecule *this)

{
  Atom *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  ElectronOpt *this_02;
  _Alloc_hider _Var1;
  Molecule *this_03;
  Uint UVar2;
  iterator iVar3;
  ostream *poVar4;
  size_t sVar5;
  pointer psVar6;
  bool bVar7;
  key_type local_98;
  shared_ptr<indigox::MolecularGraph> local_78;
  Molecule *local_68;
  _Base_ptr local_60;
  pointer local_58;
  Element_p local_50;
  long local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  UVar2 = MolecularGraph::NumConnectedComponents
                    ((this->graph_).
                     super___shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  if (UVar2 == 1) {
    psVar6 = (this->atoms_).
             super__Vector_base<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_58 = (this->atoms_).
               super__Vector_base<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    bVar7 = psVar6 == local_58;
    local_68 = this;
    if (!bVar7) {
      local_60 = &Options::AssignElectrons::ALLOWED_ELEMENTS_abi_cxx11_._M_t._M_impl.
                  super__Rb_tree_header._M_header;
      do {
        this_00 = (psVar6->super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        this_01 = (psVar6->super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_01->_M_use_count = this_01->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_01->_M_use_count = this_01->_M_use_count + 1;
          }
        }
        Atom::GetElement(this_00);
        _Var1._M_p = local_98._M_dataplus._M_p;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var1._M_p ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Not all atoms have elements assigned.",0x25);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x40);
          std::ostream::put(-0x40);
          std::ostream::flush();
LAB_0010c577:
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
          }
          if (!bVar7) {
            return 0;
          }
          break;
        }
        Atom::GetElement(this_00);
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,*(long *)(local_40 + 0x20),
                   *(long *)(local_40 + 0x28) + *(long *)(local_40 + 0x20));
        iVar3 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&Options::AssignElectrons::ALLOWED_ELEMENTS_abi_cxx11_._M_t,&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
        }
        if (iVar3._M_node == local_60) {
          Atom::GetElement(this_00);
          poVar4 = operator<<((ostream *)&std::cerr,&local_50);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4," is not an allowed element for the algorithm.",0x2d);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
          if (local_50.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_50.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          goto LAB_0010c577;
        }
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        }
        psVar6 = psVar6 + 1;
        bVar7 = psVar6 == local_58;
      } while (!bVar7);
    }
    this_03 = local_68;
    local_78.super___shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (local_68->graph_).super___shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    this_02 = (local_68->elnopt_)._M_t.
              super___uniq_ptr_impl<indigox::ElectronOpt,_std::default_delete<indigox::ElectronOpt>_>
              ._M_t.
              super__Tuple_impl<0UL,_indigox::ElectronOpt_*,_std::default_delete<indigox::ElectronOpt>_>
              .super__Head_base<0UL,_indigox::ElectronOpt_*,_false>._M_head_impl;
    local_78.super___shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (local_68->graph_).
            super___shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
    if (local_78.super___shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_78.super___shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_78.super___shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_78.super___shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_78.super___shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    ElectronOpt::SetMolecularGraph(this_02,&local_78);
    if (local_78.super___shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.super___shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    this_03->modified_ = false;
    sVar5 = ElectronOpt::Run((this_03->elnopt_)._M_t.
                             super___uniq_ptr_impl<indigox::ElectronOpt,_std::default_delete<indigox::ElectronOpt>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_indigox::ElectronOpt_*,_std::default_delete<indigox::ElectronOpt>_>
                             .super__Head_base<0UL,_indigox::ElectronOpt_*,_false>._M_head_impl);
    UVar2 = (Uint)sVar5;
    if (UVar2 != 0) {
      ApplyElectronAssignment(this_03,0);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Electrons can only be assigned when molecule has only one component.",0x44);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
    UVar2 = 0;
  }
  return UVar2;
}

Assistant:

Uint Molecule::AssignElectrons() {
  // check is single component (use graph)
  /// @todo
  if (graph_->NumConnectedComponents() != 1) {
    std::cerr << "Electrons can only be assigned when molecule has only one component." << std::endl;
    return 0;
  }
  
  // check all elements valid.
  typedef Options::AssignElectrons opt_;
  for (Atom_p atm : atoms_) {
    if (!atm->GetElement()) {
      std::cerr << "Not all atoms have elements assigned." << std::endl;
      return 0;
    }
    if (opt_::ALLOWED_ELEMENTS.find(atm->GetElement()->GetSymbol())
        == opt_::ALLOWED_ELEMENTS.end()) {
      std::cerr << atm->GetElement() << " is not an allowed element for the algorithm." << std::endl;
      return 0;
    }
  }
  
  // Set the ElectronOpt graph
  elnopt_->SetMolecularGraph(graph_);
  modified_ = false;
  Uint num = (Uint)elnopt_->Run();
  if (num) ApplyElectronAssignment(0);
//  for (auto& tmp : idx_to_atom_) {
//    Atom_p atom = tmp.second.lock();
//    if (atom->GetFormalCharge() != 0) {
//      std::cout << tmp.first << " : " << atom->GetFormalCharge() << std::endl;
//    }
//  }
//  
//  for (auto& tmp : idx_to_bond_) {
//    Bond_p bond = tmp.second.lock();
//    if (bond->GetOrder() != BondOrder::SINGLE_BOND) {
//      uid_t a = bond->GetSourceAtom()->GetIndex();
//      uid_t b = bond->GetTargetAtom()->GetIndex();
//      if (a <= b) std::cout << a << "-" << b << " : " << bond->GetOrder() << std::endl;
//      else std::cout << b << "-" << a << " : " << bond->GetOrder() << std::endl;
//    }
//  }
  return num;
}